

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O2

cmValue __thiscall cmSourceFile::GetProperty(cmSourceFile *this,string *prop)

{
  cmMakefile *this_00;
  __type _Var1;
  bool bVar2;
  int iVar3;
  cmValue cVar4;
  cmState *this_01;
  string *this_02;
  string sStack_38;
  
  _Var1 = std::operator==(prop,&propLOCATION_abi_cxx11_);
  if (_Var1) {
    if ((this->FullPath)._M_string_length != 0) {
      return (cmValue)&this->FullPath;
    }
    return (cmValue)(string *)0x0;
  }
  _Var1 = std::operator==(prop,&propINCLUDE_DIRECTORIES_abi_cxx11_);
  if (_Var1) {
    if ((this->IncludeDirectories).
        super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->IncludeDirectories).
        super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      if ((GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') &&
         (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_),
         iVar3 != 0)) {
        GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p =
             (pointer)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_.field_2;
        GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_string_length = 0;
        GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_.field_2._M_local_buf[0] = '\0';
        __cxa_atexit(std::__cxx11::string::~string,
                     &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
      }
      cmList::
      to_string<std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_0>
                (&sStack_38,&this->IncludeDirectories);
      this_02 = &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_;
LAB_001f2de3:
      std::__cxx11::string::operator=((string *)this_02,(string *)&sStack_38);
      std::__cxx11::string::~string((string *)&sStack_38);
      return (cmValue)this_02;
    }
  }
  else {
    _Var1 = std::operator==(prop,&propCOMPILE_OPTIONS_abi_cxx11_);
    if (_Var1) {
      if ((this->CompileOptions).
          super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (this->CompileOptions).
          super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        if ((GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') &&
           (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_
                                       ), iVar3 != 0)) {
          GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p =
               (pointer)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_.field_2;
          GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_string_length = 0;
          GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_.field_2._M_local_buf[0] = '\0'
          ;
          __cxa_atexit(std::__cxx11::string::~string,
                       &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
        }
        cmList::
        to_string<std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_0>
                  (&sStack_38,&this->CompileOptions);
        this_02 = &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_;
        goto LAB_001f2de3;
      }
    }
    else {
      _Var1 = std::operator==(prop,&propCOMPILE_DEFINITIONS_abi_cxx11_);
      if (_Var1) {
        if ((this->CompileDefinitions).
            super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (this->CompileDefinitions).
            super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          if ((GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') &&
             (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                           output_abi_cxx11_), iVar3 != 0)) {
            GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p =
                 (pointer)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_.field_2;
            GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_string_length = 0;
            GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_.field_2._M_local_buf[0] =
                 '\0';
            __cxa_atexit(std::__cxx11::string::~string,
                         &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,&__dso_handle)
            ;
            __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
          }
          cmList::
          to_string<std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_0>
                    (&sStack_38,&this->CompileDefinitions);
          this_02 = &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_;
          goto LAB_001f2de3;
        }
      }
      else {
        cVar4 = cmPropertyMap::GetPropertyValue(&this->Properties,prop);
        if (cVar4.Value != (string *)0x0) {
          return (cmValue)cVar4.Value;
        }
        this_00 = (this->Location).Makefile;
        this_01 = cmMakefile::GetState(this_00);
        bVar2 = cmState::IsPropertyChained(this_01,prop,SOURCE_FILE);
        if (bVar2) {
          cVar4 = cmMakefile::GetProperty(this_00,prop,true);
          return (cmValue)cVar4.Value;
        }
      }
    }
  }
  return (cmValue)(string *)0x0;
}

Assistant:

cmValue cmSourceFile::GetProperty(const std::string& prop) const
{
  // Check for computed properties.
  if (prop == propLOCATION) {
    if (this->FullPath.empty()) {
      return nullptr;
    }
    return cmValue(this->FullPath);
  }

  // Check for the properties with backtraces.
  if (prop == propINCLUDE_DIRECTORIES) {
    if (this->IncludeDirectories.empty()) {
      return nullptr;
    }

    static std::string output;
    output = cmList::to_string(this->IncludeDirectories);
    return cmValue(output);
  }

  if (prop == propCOMPILE_OPTIONS) {
    if (this->CompileOptions.empty()) {
      return nullptr;
    }

    static std::string output;
    output = cmList::to_string(this->CompileOptions);
    return cmValue(output);
  }

  if (prop == propCOMPILE_DEFINITIONS) {
    if (this->CompileDefinitions.empty()) {
      return nullptr;
    }

    static std::string output;
    output = cmList::to_string(this->CompileDefinitions);
    return cmValue(output);
  }

  cmValue retVal = this->Properties.GetPropertyValue(prop);
  if (!retVal) {
    cmMakefile const* mf = this->Location.GetMakefile();
    const bool chain =
      mf->GetState()->IsPropertyChained(prop, cmProperty::SOURCE_FILE);
    if (chain) {
      return mf->GetProperty(prop, chain);
    }
    return nullptr;
  }

  return retVal;
}